

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake_util.cc
# Opt level: O1

bool DoSplitHandshake(UniquePtr<SSL> *ssl,SettingsWriter *writer,bool is_resume)

{
  SSL *s;
  BIO *pBVar1;
  Span<const_unsigned_char> handback_00;
  __uniq_ptr_impl<ssl_st,_bssl::internal::Deleter> *p_Var2;
  _Head_base<0UL,_MockQuicTransport_*,_false> in;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  ScopedFD SVar8;
  uint uVar9;
  BIO *pBVar10;
  BIO *pBVar11;
  TestConfig *pTVar12;
  uint8_t *puVar13;
  size_t sVar14;
  SSL_CTX *pSVar15;
  TestState *pTVar16;
  uint8_t *puVar17;
  ssize_t sVar18;
  ulong uVar19;
  size_t sVar20;
  size_t sVar21;
  pair<const_int,_int> pVar22;
  size_type __new_size;
  undefined7 in_register_00000011;
  value_type *__val;
  ulong len;
  allocator_type *data;
  char *pcVar23;
  ulong uVar24;
  DTLS1_STATE *pDVar25;
  code *pcVar26;
  long lVar27;
  DTLS1_STATE *pDVar28;
  _Any_data *p_Var29;
  Span<const_unsigned_char> handoff;
  initializer_list<std::pair<const_int,_int>_> __l;
  initializer_list<int> __l_00;
  Span<const_unsigned_char> handback_01;
  char msg;
  ScopedFD control;
  ScopedProcess handshaker;
  ScopedFD wfd1_closer;
  ScopedFD rfd0_closer;
  uint8_t header [5];
  ScopedFD wfd0_closer;
  ScopedFD rfd1_closer;
  int rfd [2];
  int wfd [2];
  vector<unsigned_char,_std::allocator<unsigned_char>_> handshaker_input;
  UniquePtr<SSL> ssl_handback;
  CBS handback;
  CBS output;
  allocator_type local_23e;
  char local_23d;
  ScopedFD local_23c;
  int local_238;
  ScopedProcess local_234;
  ScopedFD local_230;
  ScopedFD local_22c;
  allocator_type local_225;
  char local_224;
  ushort local_222;
  __uniq_ptr_impl<ssl_st,_bssl::internal::Deleter> *local_220;
  BIO *local_218;
  ScopedFD local_210;
  ScopedFD local_20c;
  int local_208;
  int local_204;
  uint local_200;
  int local_1fc;
  TestConfig *local_1f8;
  code *local_1f0;
  undefined1 local_1e8 [16];
  _Head_base<0UL,_MockQuicTransport_*,_false> local_1d8;
  long lStack_1d0;
  __uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> local_1c8;
  _Head_base<0UL,_ssl_session_st_*,_false> local_1c0;
  ulong local_1b8;
  __uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter> local_1b0;
  ulong local_1a8;
  pointer local_1a0;
  pointer local_198;
  __uniq_ptr_impl<TestState,_std::default_delete<TestState>_> local_190;
  _Any_data local_188;
  code *local_178;
  code *pcStack_170;
  _Any_data local_148 [4];
  undefined1 local_108 [48];
  undefined1 local_d8 [32];
  uint8_t *local_b8;
  __uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> _Stack_b0;
  _func_void_SSL_ptr_int_int *local_a8;
  __uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter> _Stack_a0;
  __uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter> local_98;
  CRYPTO_EX_DATA CStack_90;
  uint8_t *local_88;
  size_t sStack_80;
  __uniq_ptr_impl<char,_bssl::internal::Deleter> local_78;
  SSL_QUIC_METHOD *pSStack_70;
  uint8_t *local_68;
  size_t sStack_60;
  ulong local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  local_238 = (int)CONCAT71(in_register_00000011,is_resume);
  local_1c0._M_head_impl = (ssl_session_st *)writer;
  pBVar10 = SSL_get_rbio((SSL *)(ssl->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
  pBVar11 = SSL_get_wbio((SSL *)(ssl->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
  if (pBVar10 != pBVar11) {
    __assert_fail("SSL_get_rbio(ssl->get()) == SSL_get_wbio(ssl->get())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/test/handshake_util.cc"
                  ,0x29e,"bool DoSplitHandshake(UniquePtr<SSL> *, SettingsWriter *, bool)");
  }
  local_1d8._M_head_impl = (MockQuicTransport *)0x0;
  lStack_1d0 = 0;
  local_1c8._M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
       (tuple<ssl_session_st_*,_bssl::internal::Deleter>)
       (_Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>)0x0;
  local_1f8 = GetTestConfig((ssl->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
  local_108._0_8_ =
       (ssl->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl;
  bssl::SSL_set_handoff_mode((SSL *)local_108._0_8_,true);
  pTVar12 = GetTestConfig((SSL *)local_108._0_8_);
  pcVar26 = std::
            _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/test/handshake_util.cc:639:9)>
            ::_M_manager;
  local_220 = (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter> *)ssl;
  do {
    local_188._8_8_ = 0;
    local_188._M_unused._M_object = local_108;
    pcStack_170 = std::
                  _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/test/handshake_util.cc:639:9)>
                  ::_M_invoke;
    local_178 = std::
                _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/test/handshake_util.cc:639:9)>
                ::_M_manager;
    iVar6 = CheckIdempotentError
                      ("SSL_do_handshake",(SSL *)local_108._0_8_,(function<int_()> *)&local_188);
    if (local_178 != (code *)0x0) {
      (*local_178)(&local_188,&local_188,__destroy_functor);
    }
  } while ((((-1 < iVar6) || (iVar7 = SSL_get_error((SSL *)local_108._0_8_,iVar6), iVar7 != 0x11))
           && (pTVar12->async == true)) && (bVar4 = RetryAsync((SSL *)local_108._0_8_,iVar6), bVar4)
          );
  p_Var2 = local_220;
  if ((iVar6 < 0) && (iVar6 = SSL_get_error((SSL *)local_108._0_8_,iVar6), iVar6 == 0x11)) {
    CBB_zero((CBB *)local_148);
    iVar6 = CBB_init((CBB *)local_148,0x200);
    if ((iVar6 == 0) ||
       (bVar4 = bssl::SSL_serialize_handoff
                          ((SSL *)local_108._0_8_,(CBB *)local_148,(SSL_CLIENT_HELLO *)local_d8),
       !bVar4)) {
LAB_0011eeb6:
      DoSplitHandshake();
      bVar4 = false;
    }
    else {
      puVar13 = CBB_data((CBB *)local_148);
      sVar14 = CBB_len((CBB *)local_148);
      handoff.size_ = sVar14;
      handoff.data_ = puVar13;
      bVar4 = SettingsWriter::WriteHandoff((SettingsWriter *)local_1c0._M_head_impl,handoff);
      if (!bVar4) goto LAB_0011eeb6;
      pSVar15 = (SSL_CTX *)SSL_get_SSL_CTX((SSL *)local_108._0_8_);
      bVar4 = SerializeContextState(pSVar15,(CBB *)local_148);
      if (!bVar4) goto LAB_0011eeb6;
      pTVar16 = GetTestState((SSL *)local_108._0_8_);
      bVar4 = TestState::Serialize(pTVar16,(CBB *)local_148);
      if (!bVar4) goto LAB_0011eeb6;
      puVar13 = CBB_data((CBB *)local_148);
      puVar17 = CBB_data((CBB *)local_148);
      sVar14 = CBB_len((CBB *)local_148);
      bVar4 = true;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_1d8,puVar13,
                 puVar17 + sVar14);
    }
    CBB_cleanup((CBB *)local_148);
    if (bVar4) {
      local_218 = SSL_get_rbio((SSL *)(((__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter> *)
                                       &(p_Var2->_M_t).
                                        super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>)->
                                      _M_t).
                                      super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
      lVar27 = lStack_1d0;
      in._M_head_impl = local_1d8._M_head_impl;
      iVar6 = pipe(&local_208);
      if (iVar6 == 0) {
        local_22c.fd_ = local_208;
        local_20c.fd_ = local_204;
        iVar6 = pipe((int *)&local_200);
        if (iVar6 == 0) {
          local_210.fd_ = local_200;
          local_230.fd_ = local_1fc;
          local_234.pid_ = -1;
          local_23c.fd_ = 0xffffffff;
          local_d8._4_4_ = local_208;
          local_d8._0_4_ = 4;
          local_d8._12_4_ = local_1fc;
          local_d8._8_4_ = 5;
          __l._M_len = 2;
          __l._M_array = (iterator)local_d8;
          std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
                    ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     local_108,__l,(less<int> *)local_188._M_pod_data,&local_225);
          local_148[0]._0_4_ = local_204;
          local_148[0]._4_4_ = local_200;
          __l_00._M_len = 2;
          __l_00._M_array = (iterator)local_148;
          std::vector<int,_std::allocator<int>_>::vector(&local_48,__l_00,&local_23e);
          bVar4 = StartHandshaker(&local_234,&local_23c,local_1f8,local_238._0_1_,
                                  (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)local_108,&local_48);
          if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          std::
          _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                       *)local_108);
          if (!bVar4) goto LAB_0011f672;
          if (-1 < local_22c.fd_) {
            close(local_22c.fd_);
          }
          local_22c.fd_ = -1;
          if (-1 < local_230.fd_) {
            close(local_230.fd_);
          }
          local_230.fd_ = -1;
          sVar18 = write_eintr(local_23c.fd_,in._M_head_impl,lVar27 - (long)in._M_head_impl);
          if (sVar18 != -1) {
            local_23d = local_1f8->async;
            local_1b8 = (ulong)(uint)local_23c.fd_;
            uVar9 = local_200 + 0x3f;
            if (-1 < (int)local_200) {
              uVar9 = local_200;
            }
            local_198 = (pointer)(1L << ((byte)local_200 & 0x3f));
            local_238 = local_204;
            local_1a0 = (pointer)(long)((int)uVar9 >> 6);
            SVar8.fd_ = local_23c.fd_ + 0x3f;
            if (-1 < local_23c.fd_) {
              SVar8.fd_ = local_23c.fd_;
            }
            local_1a8 = 1L << ((byte)local_23c.fd_ & 0x3f);
            local_1b0._M_t.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
                 (tuple<evp_pkey_st_*,_bssl::internal::Deleter>)(long)(SVar8.fd_ >> 6);
            local_50 = (ulong)local_200;
            SVar8.fd_ = local_23c.fd_;
            if (local_23c.fd_ < (int)local_200) {
              SVar8.fd_ = local_200;
            }
            local_1e8._12_4_ = SVar8.fd_ + 1;
LAB_0011f0e4:
            data = &local_225;
            local_68 = (uint8_t *)0x0;
            sStack_60 = 0;
            local_78._M_t.super__Tuple_impl<0UL,_char_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_char_*,_false>._M_head_impl =
                 (tuple<char_*,_bssl::internal::Deleter>)
                 (_Tuple_impl<0UL,_char_*,_bssl::internal::Deleter>)0x0;
            pSStack_70 = (SSL_QUIC_METHOD *)0x0;
            local_88 = (uint8_t *)0x0;
            sStack_80 = 0;
            local_98._M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl =
                 (tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
                 (_Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>)0x0;
            CStack_90.sk = (stack_st_void *)0x0;
            local_a8 = (_func_void_SSL_ptr_int_int *)0x0;
            _Stack_a0._M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl =
                 (tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
                 (_Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>)0x0;
            local_b8 = (uint8_t *)0x0;
            _Stack_b0._M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
                 (tuple<ssl_session_st_*,_bssl::internal::Deleter>)
                 (_Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>)0x0;
            local_d8._16_8_ = (DTLS1_STATE *)0x0;
            local_d8._24_8_ = (void *)0x0;
            local_d8._0_4_ = 0;
            local_d8._4_4_ = 0;
            local_d8._8_8_ = (DTLS1_STATE *)0x0;
            *(ulong *)(local_d8 + (long)local_1a0 * 8) =
                 *(ulong *)(local_d8 + (long)local_1a0 * 8) | (ulong)local_198;
            *(ulong *)(local_d8 +
                      (long)local_1b0._M_t.
                            super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl * 8) =
                 *(ulong *)(local_d8 +
                           (long)local_1b0._M_t.
                                 super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl * 8) |
                 local_1a8;
            iVar6 = select(local_1e8._12_4_,(fd_set *)local_d8,(fd_set *)0x0,(fd_set *)0x0,
                           (timeval *)0x0);
            if (iVar6 != -1) {
              if (((*(ulong *)(local_d8 + (long)local_1a0 * 8) & (ulong)local_198) == 0) ||
                 (sVar18 = read_eintr((int)local_50,local_148,0x40), sVar18 < 1)) {
                if ((*(ulong *)(local_d8 +
                               (long)local_1b0._M_t.
                                     super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl * 8) &
                    local_1a8) == 0) goto LAB_0011f2ac;
                sVar18 = read_eintr((int)local_1b8,&local_23e,1);
                if (sVar18 == 1) {
                  if (local_23e == (allocator_type)0x52) {
                    if (local_23d != '\0') {
                      AsyncBioAllowRead((BIO *)local_218,5);
                    }
                    lVar27 = 5;
                    local_1f0 = pcVar26;
                    do {
                      if (lVar27 == 0) {
                        if (local_224 == '\x03') {
                          uVar24 = (ulong)(ushort)(local_222 << 8 | local_222 >> 8);
                          goto LAB_0011f38f;
                        }
                        DoSplitHandshake();
                        break;
                      }
                      uVar9 = BIO_read(local_218,data,(int)lVar27);
                      uVar24 = (ulong)uVar9;
                      if ((int)uVar9 < 1) {
                        DoSplitHandshake();
LAB_0011f33b:
                        bVar4 = false;
                      }
                      else {
                        uVar19 = write_eintr(local_238,data,uVar24);
                        if (uVar19 == 0xffffffffffffffff) {
                          perror("write");
                          goto LAB_0011f33b;
                        }
                        if (uVar19 == uVar24) {
                          lVar27 = lVar27 - uVar24;
                          data = data + uVar24;
                          bVar4 = true;
                        }
                        else {
                          bVar4 = false;
                          fprintf(_stderr,"short write (%zd of %d bytes)\n",uVar19);
                        }
                      }
                    } while (bVar4);
                    goto LAB_0011f4c2;
                  }
                  iVar6 = 1;
                  pcVar26 = (code *)CONCAT71((int7)((ulong)pcVar26 >> 8),1);
                  if (local_23e != (allocator_type)0x48) {
                    if (local_23e == (allocator_type)0x45) goto LAB_0011f4c2;
                    fprintf(_stderr,"Unknown control message from handshaker: %c\n",
                            (ulong)(uint)(int)(char)local_23e);
                    pcVar26 = (code *)0x0;
                  }
                }
                else {
                  pcVar23 = "read";
LAB_0011f4b8:
                  perror(pcVar23);
LAB_0011f4c2:
                  iVar6 = 1;
                  pcVar26 = (code *)0x0;
                }
              }
              else {
                p_Var29 = local_148;
                do {
                  uVar9 = BIO_write(local_218,p_Var29,(int)sVar18);
                  if (uVar9 == 0) {
                    DoSplitHandshake();
LAB_0011f220:
                    iVar6 = 1;
                    pcVar26 = (code *)0x0;
                  }
                  else if ((int)uVar9 < 0) {
                    if (local_23d == '\0') {
                      DoSplitHandshake();
                      goto LAB_0011f220;
                    }
                    iVar6 = 9;
                    AsyncBioAllowWrite((BIO *)local_218,1);
                  }
                  else {
                    p_Var29 = (_Any_data *)((long)p_Var29 + (ulong)uVar9);
                    sVar18 = sVar18 - (ulong)uVar9;
                    iVar6 = 0;
                  }
                  if ((iVar6 != 9) && (iVar6 != 0)) goto LAB_0011f4c5;
                } while (sVar18 != 0);
LAB_0011f2ac:
                iVar6 = 3;
              }
              goto LAB_0011f4c5;
            }
            perror("select");
            bVar4 = true;
            pcVar26 = (code *)0x0;
            goto LAB_0011f4cb;
          }
          pcVar23 = "write";
          goto LAB_0011f666;
        }
        perror("pipe");
        pDVar28 = (DTLS1_STATE *)0x0;
        pDVar25 = (DTLS1_STATE *)0x0;
        pVar22.first = 0;
        pVar22.second = 0;
        bVar4 = false;
        goto LAB_0011f6aa;
      }
      perror("pipe");
      pDVar28 = (DTLS1_STATE *)0x0;
      pDVar25 = (DTLS1_STATE *)0x0;
      pVar22.first = 0;
      pVar22.second = 0;
      bVar4 = false;
      goto LAB_0011f6be;
    }
  }
  else {
    fwrite("Handshake failed while waiting for handoff.\n",0x2c,1,_stderr);
  }
  pDVar28 = (DTLS1_STATE *)0x0;
  pVar22.first = 0;
  pVar22.second = 0;
LAB_0011f7f4:
  fwrite("Handoff failed.\n",0x10,1,_stderr);
  bVar4 = false;
LAB_0011f8f3:
  if (pVar22 != (pair<const_int,_int>)0x0) {
    operator_delete((void *)pVar22,(long)pDVar28 - (long)pVar22);
  }
  if ((_Head_base<0UL,_MockQuicTransport_*,_false>)local_1d8._M_head_impl !=
      (_Head_base<0UL,_MockQuicTransport_*,_false>)0x0) {
    operator_delete(local_1d8._M_head_impl,
                    (long)local_1c8._M_t.
                          super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl -
                    (long)local_1d8._M_head_impl);
  }
  return bVar4;
LAB_0011f38f:
  do {
    if (uVar24 == 0) {
      local_23e = (allocator_type)0x57;
      sVar18 = write_eintr((int)local_1b8,&local_23e,1);
      iVar6 = 0;
      pcVar26 = local_1f0;
      if (sVar18 == 1) goto LAB_0011f4c5;
      pcVar23 = "write";
      goto LAB_0011f4b8;
    }
    sVar14 = 0x40;
    if (uVar24 < 0x40) {
      sVar14 = uVar24;
    }
    if (local_23d != '\0') {
      AsyncBioAllowRead((BIO *)local_218,sVar14);
    }
    p_Var29 = &local_188;
    sVar21 = sVar14;
    do {
      sVar20 = sVar21;
      if (sVar20 == 0) goto LAB_0011f45d;
      uVar9 = BIO_read(local_218,p_Var29,(int)sVar20);
      if ((int)uVar9 < 1) {
        DoSplitHandshake();
LAB_0011f44c:
        bVar4 = false;
        sVar21 = sVar20;
      }
      else {
        len = (ulong)uVar9;
        uVar19 = write_eintr(local_238,p_Var29,len);
        if (uVar19 == 0xffffffffffffffff) {
          perror("write");
          goto LAB_0011f44c;
        }
        if (uVar19 != len) {
          fprintf(_stderr,"short write (%zd of %d bytes)\n",uVar19);
          goto LAB_0011f44c;
        }
        p_Var29 = (_Any_data *)((long)p_Var29 + len);
        bVar4 = true;
        sVar21 = sVar20 - len;
      }
    } while (bVar4);
    local_1f0 = (code *)0x0;
    sVar14 = 0;
LAB_0011f45d:
    uVar24 = uVar24 - sVar14;
  } while (sVar20 == 0);
  iVar6 = 1;
  pcVar26 = local_1f0;
LAB_0011f4c5:
  bVar4 = iVar6 == 1;
LAB_0011f4cb:
  if (bVar4) goto LAB_0011f4dc;
  goto LAB_0011f0e4;
LAB_0011f4dc:
  bVar4 = ScopedProcess::Wait(&local_234,(int *)local_148[0]._M_pod_data);
  if (bVar4) {
    if ((local_148[0]._0_4_ != 0 & (byte)pcVar26) == 1) {
      DoSplitHandshake();
      goto LAB_0011f672;
    }
    if (((ulong)pcVar26 & 1) == 0) goto LAB_0011f672;
    local_d8._0_4_ = 0;
    local_d8._4_4_ = 0;
    local_d8._8_8_ = (DTLS1_STATE *)0x0;
    local_d8._16_8_ = (_func_void_int_int_int_void_ptr_size_t_SSL_ptr_void_ptr *)0x0;
    pVar22 = (pair<const_int,_int>)operator_new(0x100000);
    local_d8._0_8_ = pVar22;
    local_d8._8_8_ = pVar22;
    local_d8._16_8_ = (DTLS1_STATE *)((long)pVar22 + 0x100000);
    memset((void *)pVar22,0,0x100000);
    local_d8._8_8_ = (DTLS1_STATE *)((long)pVar22 + 0x100000);
    __new_size = read_eintr(local_23c.fd_,(void *)pVar22,0x100000);
    bVar4 = __new_size != 0xffffffffffffffff;
    if (__new_size == 0xffffffffffffffff) {
      perror("read");
      pDVar28 = (DTLS1_STATE *)0x0;
      pDVar25 = (DTLS1_STATE *)0x0;
      pVar22.first = 0;
      pVar22.second = 0;
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8,__new_size);
      pDVar28 = (DTLS1_STATE *)local_d8._16_8_;
      pDVar25 = (DTLS1_STATE *)local_d8._8_8_;
      pVar22 = (pair<const_int,_int>)local_d8._0_8_;
      local_d8._0_4_ = 0;
      local_d8._4_4_ = 0;
      local_d8._8_8_ = (DTLS1_STATE *)0x0;
      local_d8._16_8_ = (DTLS1_STATE *)0x0;
    }
    if ((pair<const_int,_int>)local_d8._0_8_ != (pair<const_int,_int>)0x0) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ - local_d8._0_8_);
    }
  }
  else {
    pcVar23 = "waitpid";
LAB_0011f666:
    perror(pcVar23);
LAB_0011f672:
    pDVar28 = (DTLS1_STATE *)0x0;
    pDVar25 = (DTLS1_STATE *)0x0;
    pVar22.first = 0;
    pVar22.second = 0;
    bVar4 = false;
  }
  ScopedFD::~ScopedFD(&local_23c);
  ScopedProcess::Reset(&local_234,-1);
  ScopedFD::~ScopedFD(&local_230);
  ScopedFD::~ScopedFD(&local_210);
LAB_0011f6aa:
  ScopedFD::~ScopedFD(&local_20c);
  ScopedFD::~ScopedFD(&local_22c);
LAB_0011f6be:
  if (bVar4) {
    pSVar15 = (SSL_CTX *)
              SSL_get_SSL_CTX((SSL *)(((__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter> *)
                                      &(local_220->_M_t).
                                       super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>)->
                                     _M_t).super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                     .super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    local_190._M_t.super__Tuple_impl<0UL,_TestState_*,_std::default_delete<TestState>_>.
    super__Head_base<0UL,_TestState_*,_false>._M_head_impl =
         (tuple<TestState_*,_std::default_delete<TestState>_>)
         (_Tuple_impl<0UL,_TestState_*,_std::default_delete<TestState>_>)0x0;
    sVar14 = 0;
    TestConfig::NewSSL((TestConfig *)&local_188,(SSL_CTX *)local_1f8,(SSL_SESSION *)pSVar15,
                       (unique_ptr<TestState,_std::default_delete<TestState>_> *)0x0);
    std::unique_ptr<TestState,_std::default_delete<TestState>_>::~unique_ptr
              ((unique_ptr<TestState,_std::default_delete<TestState>_> *)&local_190);
    if ((SSL *)local_188._M_unused._0_8_ == (SSL *)0x0) {
      bVar4 = false;
    }
    else {
      local_d8._8_8_ = (long)pDVar25 - (long)pVar22;
      local_d8._0_8_ = pVar22;
      iVar6 = CBS_get_u24_length_prefixed((CBS *)local_d8,(CBS *)local_148);
      bVar4 = true;
      if ((iVar6 == 0) ||
         (bVar5 = DeserializeContextState((CBS *)local_d8,pSVar15),
         uVar3 = local_188._M_unused._0_8_, !bVar5)) {
        bVar5 = false;
      }
      else {
        TestState::Deserialize((TestState *)local_1e8,(CBS *)local_d8,pSVar15);
        bVar4 = SetTestState((SSL *)uVar3,
                             (unique_ptr<TestState,_std::default_delete<TestState>_> *)local_1e8);
        bVar5 = true;
        if (((bVar4) &&
            (pTVar16 = GetTestState((SSL *)local_188._M_unused._0_8_), pTVar16 != (TestState *)0x0))
           && (handback_00.data_._4_4_ = local_148[0]._4_4_,
              handback_00.data_._0_4_ = local_148[0]._0_4_, handback_00.size_ = local_148[0]._8_8_,
              bVar4 = SettingsWriter::WriteHandback
                                ((SettingsWriter *)local_1c0._M_head_impl,handback_00), bVar4)) {
          handback_01.size_ = sVar14;
          handback_01.data_ = (uchar *)local_148[0]._8_8_;
          bVar4 = bssl::SSL_apply_handback
                            ((bssl *)local_188._M_unused._0_8_,
                             (SSL *)CONCAT44(local_148[0]._4_4_,local_148[0]._0_4_),handback_01);
          bVar4 = !bVar4;
        }
        else {
          bVar4 = true;
        }
      }
      if (bVar5) {
        std::unique_ptr<TestState,_std::default_delete<TestState>_>::~unique_ptr
                  ((unique_ptr<TestState,_std::default_delete<TestState>_> *)local_1e8);
      }
      uVar3 = local_188._M_unused._0_8_;
      if (bVar4 == false) {
        s = (SSL *)(((__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter> *)
                    &(local_220->_M_t).super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>)->
                   _M_t).super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl;
        pBVar10 = SSL_get_rbio(s);
        BIO_up_ref((BIO *)pBVar10);
        SSL_set0_rbio((SSL *)uVar3,(BIO *)pBVar10);
        pBVar10 = SSL_get_wbio(s);
        BIO_up_ref((BIO *)pBVar10);
        SSL_set0_wbio((SSL *)uVar3,(BIO *)pBVar10);
        SSL_set0_rbio((SSL *)s,(BIO *)0x0);
        SSL_set0_wbio((SSL *)s,(BIO *)0x0);
        pTVar16 = GetTestState((((__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter> *)
                                &(local_220->_M_t).
                                 super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>)->_M_t).
                               super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        pBVar1 = pTVar16->async_bio;
        pTVar16 = GetTestState((SSL *)local_188._M_unused._0_8_);
        pTVar16->async_bio = pBVar1;
        pTVar16 = GetTestState((((__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter> *)
                                &(local_220->_M_t).
                                 super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>)->_M_t).
                               super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        uVar3 = local_188._M_unused._0_8_;
        pTVar16->async_bio = (BIO *)0x0;
        local_188._M_unused._M_object = (SSL *)0x0;
        std::__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>::reset(local_220,(pointer)uVar3);
      }
      else {
        DoSplitHandshake();
      }
      bVar4 = (bool)(bVar4 ^ 1);
    }
    std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_188);
    goto LAB_0011f8f3;
  }
  goto LAB_0011f7f4;
}

Assistant:

bool DoSplitHandshake(UniquePtr<SSL> *ssl, SettingsWriter *writer,
                      bool is_resume) {
  assert(SSL_get_rbio(ssl->get()) == SSL_get_wbio(ssl->get()));
  std::vector<uint8_t> handshaker_input;
  const TestConfig *config = GetTestConfig(ssl->get());
  // out is the response from the handshaker, which includes a serialized
  // handback message, but also serialized updates to the |TestState|.
  std::vector<uint8_t> out;
  if (!PrepareHandoff(ssl->get(), writer, &handshaker_input) ||
      !RunHandshaker(SSL_get_rbio(ssl->get()), config, is_resume,
                     handshaker_input, &out)) {
    fprintf(stderr, "Handoff failed.\n");
    return false;
  }

  SSL_CTX *ctx = SSL_get_SSL_CTX(ssl->get());
  UniquePtr<SSL> ssl_handback = config->NewSSL(ctx, nullptr, nullptr);
  if (!ssl_handback) {
    return false;
  }
  CBS output, handback;
  CBS_init(&output, out.data(), out.size());
  if (!CBS_get_u24_length_prefixed(&output, &handback) ||
      !DeserializeContextState(&output, ctx) ||
      !SetTestState(ssl_handback.get(), TestState::Deserialize(&output, ctx)) ||
      !GetTestState(ssl_handback.get()) || !writer->WriteHandback(handback) ||
      !SSL_apply_handback(ssl_handback.get(), handback)) {
    fprintf(stderr, "Handback failed.\n");
    return false;
  }
  MoveBIOs(ssl_handback.get(), ssl->get());
  GetTestState(ssl_handback.get())->async_bio =
      GetTestState(ssl->get())->async_bio;
  GetTestState(ssl->get())->async_bio = nullptr;

  *ssl = std::move(ssl_handback);
  return true;
}